

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int add_pax_acl(archive_write *a,archive_entry *entry,pax *pax,int flags)

{
  wchar_t wVar1;
  char *value;
  int *piVar2;
  char *pcStack_40;
  int acl_types;
  char *attr;
  char *p;
  int flags_local;
  pax *pax_local;
  archive_entry *entry_local;
  archive_write *a_local;
  
  wVar1 = archive_entry_acl_types(entry);
  if ((wVar1 & 0x3c00U) == 0) {
    if ((flags & 0x100U) == 0) {
      if ((flags & 0x200U) == 0) {
        return -0x1e;
      }
      pcStack_40 = "SCHILY.acl.default";
    }
    else {
      pcStack_40 = "SCHILY.acl.access";
    }
  }
  else {
    pcStack_40 = "SCHILY.acl.ace";
  }
  value = _archive_entry_acl_to_text_l(entry,(ssize_t *)0x0,flags,pax->sconv_utf8);
  if (value == (char *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      archive_set_error(&a->archive,0xc,"%s %s","Can\'t allocate memory for ",pcStack_40);
      a_local._4_4_ = -0x1e;
    }
    else {
      archive_set_error(&a->archive,0x54,"%s %s %s","Can\'t translate ",pcStack_40," to UTF-8");
      a_local._4_4_ = -0x14;
    }
  }
  else {
    if (*value != '\0') {
      add_pax_attr(&pax->pax_header,pcStack_40,value);
    }
    free(value);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
add_pax_acl(struct archive_write *a,
    struct archive_entry *entry, struct pax *pax, int flags)
{
	char *p;
	const char *attr;
	int acl_types;

	acl_types = archive_entry_acl_types(entry);

	if ((acl_types & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0)
		attr = "SCHILY.acl.ace";
	else if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)
		attr = "SCHILY.acl.access";
	else if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0)
		attr = "SCHILY.acl.default";
	else
		return (ARCHIVE_FATAL);

	p = archive_entry_acl_to_text_l(entry, NULL, flags, pax->sconv_utf8);
	if (p == NULL) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM, "%s %s",
			    "Can't allocate memory for ", attr);
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT, "%s %s %s",
		    "Can't translate ", attr, " to UTF-8");
		return(ARCHIVE_WARN);
	}

	if (*p != '\0') {
		add_pax_attr(&(pax->pax_header),
		    attr, p);
	}
	free(p);
	return(ARCHIVE_OK);
}